

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdGetBaseTapLeaf(void *handle,void *tree_handle,uint8_t *leaf_version,char **tapscript,
                     char **tap_leaf_hash)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  bool bVar1;
  uint8_t uVar2;
  reference this_00;
  char *pcVar3;
  reference this_01;
  char *pcVar4;
  string local_a0;
  void *local_80;
  char *work_tapscript;
  char *local_70;
  Script local_68;
  
  work_tapscript = (char *)0x0;
  local_70 = (char *)0x0;
  local_80 = handle;
  cfd::Initialize();
  std::__cxx11::string::string((string *)&local_68,"TapscriptTree",(allocator *)&local_a0);
  cfd::capi::CheckBuffer(tree_handle,(string *)&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
          ((long)tree_handle + 0x18);
  if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    this_01 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                   **)((long)tree_handle + 0x10),0);
    if (tapscript == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::TapBranch::GetScript(&local_68,&this_01->super_TapBranch);
      cfd::core::Script::GetHex_abi_cxx11_(&local_a0,&local_68);
      pcVar3 = cfd::capi::CreateString(&local_a0);
      work_tapscript = pcVar3;
      std::__cxx11::string::~string((string *)&local_a0);
      cfd::core::Script::~Script(&local_68);
    }
    if (tap_leaf_hash == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::TaprootScriptTree::GetTapLeafHash((ByteData256 *)&local_a0,this_01);
      cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_68,(ByteData256 *)&local_a0);
      pcVar4 = cfd::capi::CreateString((string *)&local_68);
      local_70 = pcVar4;
      std::__cxx11::string::~string((string *)&local_68);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
    }
    if (leaf_version != (uint8_t *)0x0) {
      uVar2 = cfd::core::TapBranch::GetLeafVersion(&this_01->super_TapBranch);
      *leaf_version = uVar2;
    }
    goto LAB_0035f27e;
  }
  this_00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0);
  bVar1 = cfd::core::TapBranch::HasTapLeaf(this_00);
  if (bVar1) {
    if (tapscript == (char **)0x0) {
      pcVar3 = (char *)0x0;
    }
    else {
      cfd::core::TapBranch::GetScript(&local_68,this_00);
      cfd::core::Script::GetHex_abi_cxx11_(&local_a0,&local_68);
      pcVar3 = cfd::capi::CreateString(&local_a0);
      work_tapscript = pcVar3;
      std::__cxx11::string::~string((string *)&local_a0);
      cfd::core::Script::~Script(&local_68);
    }
    if (leaf_version != (uint8_t *)0x0) {
      uVar2 = cfd::core::TapBranch::GetLeafVersion(this_00);
LAB_0035f234:
      *leaf_version = uVar2;
    }
  }
  else {
    uVar2 = '\0';
    pcVar3 = (char *)0x0;
    if (leaf_version != (uint8_t *)0x0) goto LAB_0035f234;
  }
  if (tap_leaf_hash == (char **)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    cfd::core::TapBranch::GetBaseHash((ByteData256 *)&local_a0,this_00);
    cfd::core::ByteData256::GetHex_abi_cxx11_((string *)&local_68,(ByteData256 *)&local_a0);
    pcVar4 = cfd::capi::CreateString((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a0);
  }
LAB_0035f27e:
  if (tapscript != (char **)0x0) {
    *tapscript = pcVar3;
  }
  if (tap_leaf_hash != (char **)0x0) {
    *tap_leaf_hash = pcVar4;
  }
  return 0;
}

Assistant:

int CfdGetBaseTapLeaf(
    void* handle, void* tree_handle, uint8_t* leaf_version, char** tapscript,
    char** tap_leaf_hash) {
  int result = CfdErrorCode::kCfdUnknownError;
  char* work_tapscript = nullptr;
  char* work_tap_leaf_hash = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    if (!buffer->branch_buffer->empty()) {
      auto& branch = buffer->branch_buffer->at(0);
      if (branch.HasTapLeaf()) {
        if (tapscript != nullptr) {
          work_tapscript = CreateString(branch.GetScript().GetHex());
        }
        if (leaf_version != nullptr) *leaf_version = branch.GetLeafVersion();
      } else {
        if (leaf_version != nullptr) *leaf_version = 0;
      }
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(branch.GetBaseHash().GetHex());
      }
    } else {
      auto& tree = buffer->tree_buffer->at(0);
      if (tapscript != nullptr) {
        work_tapscript = CreateString(tree.GetScript().GetHex());
      }
      if (tap_leaf_hash != nullptr) {
        work_tap_leaf_hash = CreateString(tree.GetTapLeafHash().GetHex());
      }
      if (leaf_version != nullptr) *leaf_version = tree.GetLeafVersion();
    }

    if (tapscript != nullptr) *tapscript = work_tapscript;
    if (tap_leaf_hash != nullptr) *tap_leaf_hash = work_tap_leaf_hash;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  FreeBufferOnError(&work_tapscript, &work_tap_leaf_hash);
  return result;
}